

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O0

void __thiscall QPicturePaintEngine::updateRenderHints(QPicturePaintEngine *this,RenderHints hints)

{
  QPicturePaintEnginePrivate *pQVar1;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  int pos;
  QPicturePaintEnginePrivate *d;
  quint32 in_stack_ffffffffffffff7c;
  QDataStream *in_stack_ffffffffffffff80;
  QRect *this_00;
  QRect *r;
  QRectF *pQVar2;
  undefined1 corr;
  QRectF *in_stack_ffffffffffffffc0;
  Representation in_stack_ffffffffffffffcc;
  QPicturePaintEngine *in_stack_ffffffffffffffd0;
  QFlags local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  pQVar1 = d_func((QPicturePaintEngine *)0x3109d4);
  corr = (undefined1)((ulong)pQVar2 >> 0x38);
  pQVar1->pic_d->trecs = pQVar1->pic_d->trecs + 1;
  QDataStream::operator<<(in_stack_ffffffffffffff80,(quint8)(in_stack_ffffffffffffff7c >> 0x18));
  QDataStream::operator<<(in_stack_ffffffffffffff80,(quint8)(in_stack_ffffffffffffff7c >> 0x18));
  QBuffer::pos();
  this_00 = (QRect *)&pQVar1->s;
  ::QFlags::operator_cast_to_unsigned_int(local_c);
  QDataStream::operator<<((QDataStream *)this_00,in_stack_ffffffffffffff7c);
  r = (QRect *)&stack0xffffffffffffffc0;
  QRect::QRect(this_00);
  QRectF::QRectF(in_RDI,r);
  writeCmdLength(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc.m_i,in_stack_ffffffffffffffc0,
                 (bool)corr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::updateRenderHints(QPainter::RenderHints hints)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> updateRenderHints(): " << hints;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcSetRenderHint);
    d->s << (quint32) hints;
    writeCmdLength(pos, QRect(), false);
}